

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O0

void dumpInfoDict(QPDF *pdf,ostream *os,string *sep)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [8];
  string val;
  T *it;
  iterator __end2;
  iterator __begin2;
  string local_b0 [32];
  QPDFObjectHandle local_90;
  QPDFDictItems local_80 [16];
  QPDFDictItems *local_70;
  QPDFDictItems *__range2;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  QPDFObjectHandle trailer;
  string *sep_local;
  ostream *os_local;
  QPDF *pdf_local;
  
  trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sep;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"/Info",&local_51);
  bVar1 = QPDFObjectHandle::hasKey((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_b0,"/Info",
               (allocator<char> *)
               ((long)&__begin2.ivalue.second.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount + 7));
    QPDFObjectHandle::getKey((string *)&local_90);
    QPDFObjectHandle::ditems();
    QPDFObjectHandle::~QPDFObjectHandle(&local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&__begin2.ivalue.second.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount + 7));
    local_70 = local_80;
    QPDFObjectHandle::QPDFDictItems::begin();
    QPDFObjectHandle::QPDFDictItems::end();
    while (bVar2 = QPDFObjectHandle::QPDFDictItems::iterator::operator!=
                             ((iterator *)
                              &__end2.ivalue.second.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,(iterator *)&it), bVar2) {
      val.field_2._8_8_ = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
      std::__cxx11::string::string(local_170);
      bVar1 = QPDFObjectHandle::isString();
      if ((bVar1 & 1) == 0) {
        bVar1 = QPDFObjectHandle::isName();
        if ((bVar1 & 1) == 0) {
          QPDFObjectHandle::unparseResolved_abi_cxx11_();
          std::__cxx11::string::operator=(local_170,local_1d0);
          std::__cxx11::string::~string(local_1d0);
        }
        else {
          QPDFObjectHandle::getName_abi_cxx11_();
          std::__cxx11::string::operator=(local_170,local_1b0);
          std::__cxx11::string::~string(local_1b0);
        }
      }
      else {
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        std::__cxx11::string::operator=(local_170,local_190);
        std::__cxx11::string::~string(local_190);
      }
      std::__cxx11::string::substr((ulong)local_1f0,val.field_2._8_8_);
      poVar3 = std::operator<<(os,local_1f0);
      poVar3 = std::operator<<(poVar3,(string *)
                                      trailer.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi);
      poVar3 = std::operator<<(poVar3,local_170);
      std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_170);
      QPDFObjectHandle::QPDFDictItems::iterator::operator++
                ((iterator *)
                 &__end2.ivalue.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&it);
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator
              ((iterator *)
               &__end2.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::QPDFDictItems::~QPDFDictItems(local_80);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return;
}

Assistant:

void
dumpInfoDict(QPDF& pdf, std::ostream& os = std::cout, std::string const& sep = ":\t")
{
    QPDFObjectHandle trailer = pdf.getTrailer();
    if (trailer.hasKey("/Info")) {
        for (auto& it: trailer.getKey("/Info").ditems()) {
            std::string val;
            if (it.second.isString()) {
                val = it.second.getStringValue();
            } else if (it.second.isName()) {
                val = it.second.getName();
            } else // according to PDF Spec 1.5, shouldn't happen
            {
                val = it.second.unparseResolved();
            }
            os << it.first.substr(1) << sep << val << std::endl; // skip '/'
        }
    }
}